

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O1

void __thiscall EOClient::Tick(EOClient *this)

{
  string *data_00;
  uint *puVar1;
  size_t *psVar2;
  FileType FVar3;
  PacketState PVar4;
  FILE *__stream;
  _List_node_base *p_Var5;
  size_type sVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  uint uVar10;
  ulong uVar11;
  size_t sVar12;
  mapped_type *this_00;
  size_t __len;
  ulong uVar13;
  size_t sVar14;
  string empty;
  string data;
  key_type local_70;
  uchar *local_50;
  size_t local_48;
  uchar local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = '\0';
  __stream = (FILE *)this->upload_fh;
  if (__stream == (FILE *)0x0) {
    sVar14 = 1;
    if (this->packet_state == ReadData) {
      sVar14 = (size_t)this->length;
    }
    Client::Recv_abi_cxx11_(&local_70,&this->super_Client,sVar14);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if (local_48 != 0) {
      data_00 = &this->data;
      bVar9 = false;
      do {
        PVar4 = this->packet_state;
        if (PVar4 == ReadLen1) {
          this->raw_length[0] = *local_50;
          *local_50 = '\0';
          std::__cxx11::string::erase((ulong)&local_50,0);
          this->packet_state = ReadLen2;
          if (local_48 != 0) goto LAB_0013333a;
        }
        else if (PVar4 == ReadLen2) {
LAB_0013333a:
          this->raw_length[1] = *local_50;
          *local_50 = '\0';
          std::__cxx11::string::erase((ulong)&local_50,0);
          uVar10 = PacketProcessor::Number(this->raw_length[0],this->raw_length[1],0xfe,0xfe);
          this->length = uVar10;
          this->packet_state = ReadData;
          if (local_48 != 0) goto LAB_00133392;
        }
        else {
          if (PVar4 == ReadData) {
LAB_00133392:
            sVar6 = (this->data)._M_string_length;
            std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_50);
            std::__cxx11::string::_M_append((char *)data_00,(ulong)local_70._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,
                              CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                       local_70.field_2._M_local_buf[0]) + 1);
            }
            uVar13 = (ulong)this->length;
            if (local_48 < this->length) {
              uVar13 = local_48;
            }
            if (uVar13 != 0) {
              memset(local_50,0,uVar13);
            }
            std::__cxx11::string::erase((ulong)&local_50,0);
            puVar1 = &this->length;
            *puVar1 = *puVar1 + ((int)sVar6 - (int)(this->data)._M_string_length);
            if (*puVar1 != 0) goto LAB_00133460;
            Execute(this,data_00);
            sVar12 = (this->data)._M_string_length;
            bVar9 = true;
            if (sVar12 != 0) {
              memset((data_00->_M_dataplus)._M_p,0,sVar12);
            }
          }
          else {
            memset(local_50,0,local_48);
            sVar12 = (this->data)._M_string_length;
            if (sVar12 != 0) {
              memset((this->data)._M_dataplus._M_p,0,sVar12);
            }
            local_48 = 0;
            *local_50 = '\0';
          }
          (this->data)._M_string_length = 0;
          *(this->data)._M_dataplus._M_p = '\0';
          this->packet_state = ReadLen1;
        }
LAB_00133460:
      } while ((local_48 != 0) && (!bVar9));
    }
    goto LAB_0013353d;
  }
  uVar13 = this->upload_size - this->upload_pos;
  uVar11 = (this->super_Client).send_buffer._M_string_length - (this->super_Client).send_buffer_used
  ;
  if (uVar11 < uVar13) {
    uVar13 = uVar11;
  }
  if (uVar13 == 0) {
    if ((this->upload_size == this->upload_pos) &&
       (uVar11 == (this->super_Client).send_buffer._M_string_length)) {
      fclose(__stream);
      this->upload_fh = (FILE *)0x0;
      this->upload_pos = 0;
      this->upload_size = 0;
      std::__cxx11::string::swap((string *)&(this->super_Client).send_buffer);
      sVar14 = (this->super_Client).send_buffer_gpos;
      (this->super_Client).send_buffer_gpos = this->send_buffer2_gpos;
      this->send_buffer2_gpos = sVar14;
      sVar14 = (this->super_Client).send_buffer_ppos;
      sVar7 = (this->super_Client).send_buffer_used;
      sVar8 = this->send_buffer2_used;
      (this->super_Client).send_buffer_ppos = this->send_buffer2_ppos;
      (this->super_Client).send_buffer_used = sVar8;
      this->send_buffer2_ppos = sVar14;
      this->send_buffer2_used = sVar7;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::swap((string *)&this->send_buffer2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
    }
    goto LAB_0013353d;
  }
  sVar12 = fread((this->super_Client).send_buffer._M_dataplus._M_p +
                 (this->super_Client).send_buffer_ppos,1,uVar13,__stream);
  FVar3 = this->upload_type;
  if (FVar3 == FILE_MAP) {
    p_Var5 = (this->super_Client).server[1].clients.
             super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
             super__List_node_base._M_prev;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"GlobalPK","");
    this_00 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&p_Var5[0x19]._M_prev,&local_70);
    bVar9 = util::variant::GetBool(this_00);
    if (!bVar9) goto LAB_0013347c;
    bVar9 = World::PKExcept((World *)(this->super_Client).server[1].clients.
                                     super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl.
                                     _M_node.super__List_node_base._M_prev,
                            (int)this->player->character->mapid);
    bVar9 = !bVar9;
  }
  else {
LAB_0013347c:
    bVar9 = false;
  }
  if ((FVar3 == FILE_MAP) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if (bVar9) {
    uVar13 = this->upload_pos;
    if ((uVar13 < 4) && (3 < uVar13 + sVar12)) {
      (this->super_Client).send_buffer._M_dataplus._M_p
      [((this->super_Client).send_buffer_ppos - uVar13) + 3] = -1;
    }
    uVar13 = this->upload_pos;
    if ((uVar13 < 4) && (4 < uVar13 + sVar12)) {
      (this->super_Client).send_buffer._M_dataplus._M_p
      [((this->super_Client).send_buffer_ppos - uVar13) + 4] = '\x01';
    }
    uVar13 = this->upload_pos;
    if ((uVar13 < 0x20) && (0x1f < sVar12 + uVar13)) {
      (this->super_Client).send_buffer._M_dataplus._M_p
      [((this->super_Client).send_buffer_ppos - uVar13) + 0x1f] = '\x04';
    }
  }
  this->upload_pos = this->upload_pos + sVar12;
  psVar2 = &(this->super_Client).send_buffer_ppos;
  *psVar2 = *psVar2 + sVar12;
  psVar2 = &(this->super_Client).send_buffer_used;
  *psVar2 = *psVar2 + sVar12;
LAB_0013353d:
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void EOClient::Tick()
{
	std::string data;
	int done = false;
	int oldlength;

	if (this->upload_fh)
	{
		// Send more of the file instead of doing other tasks
		std::size_t upload_available = std::min(this->upload_size - this->upload_pos, Client::SendBufferRemaining());

		if (upload_available != 0)
		{
			upload_available = std::fread(&this->send_buffer[this->send_buffer_ppos], 1, upload_available, this->upload_fh);

			// Dynamically rewrite the bytes of the map to enable PK
			if (this->upload_type == FILE_MAP && this->server()->world->config["GlobalPK"] && !this->server()->world->PKExcept(player->character->mapid))
			{
				if (this->upload_pos <= 0x03 && this->upload_pos + upload_available > 0x03)
					this->send_buffer[this->send_buffer_ppos + 0x03 - this->upload_pos] = 0xFF;

				if (this->upload_pos <= 0x03 && this->upload_pos + upload_available > 0x04)
					this->send_buffer[this->send_buffer_ppos + 0x04 - this->upload_pos] = 0x01;

				if (this->upload_pos <= 0x1F && this->upload_pos + upload_available > 0x1F)
					this->send_buffer[this->send_buffer_ppos + 0x1F - this->upload_pos] = 0x04;
			}

			this->upload_pos += upload_available;
			this->send_buffer_ppos += upload_available;
			this->send_buffer_used += upload_available;
		}
		else if (this->upload_pos == this->upload_size && this->SendBufferRemaining() == this->send_buffer.length())
		{
			using std::swap;

			std::fclose(this->upload_fh);
			this->upload_fh = 0;
			this->upload_pos = 0;
			this->upload_size = 0;

			// Place our temporary buffer back as the real one
			swap(this->send_buffer, this->send_buffer2);
			swap(this->send_buffer_gpos, this->send_buffer2_gpos);
			swap(this->send_buffer_ppos, this->send_buffer2_ppos);
			swap(this->send_buffer_used, this->send_buffer2_used);

			// We're not using this anymore...
			std::string empty;
			swap(this->send_buffer2, empty);
		}
	}
	else
	{
		data = this->Recv((this->packet_state == EOClient::ReadData) ? this->length : 1);

		while (data.length() > 0 && !done)
		{
			switch (this->packet_state)
			{
				case EOClient::ReadLen1:
					this->raw_length[0] = data[0];
					data[0] = '\0';
					data.erase(0, 1);
					this->packet_state = EOClient::ReadLen2;

					if (data.length() == 0)
					{
						break;
					}

				case EOClient::ReadLen2:
					this->raw_length[1] = data[0];
					data[0] = '\0';
					data.erase(0, 1);
					this->length = PacketProcessor::Number(this->raw_length[0], this->raw_length[1]);
					this->packet_state = EOClient::ReadData;

					if (data.length() == 0)
					{
						break;
					}

				case EOClient::ReadData:
					oldlength = this->data.length();
					this->data += data.substr(0, this->length);
					std::fill(data.begin(), data.begin() + std::min<std::size_t>(data.length(), this->length), '\0');
					data.erase(0, this->length);
					this->length -= this->data.length() - oldlength;

					if (this->length == 0)
					{
						this->Execute(this->data);

						std::fill(UTIL_RANGE(this->data), '\0');
						this->data.erase();
						this->packet_state = EOClient::ReadLen1;

						done = true;
					}
					break;

				default:
					// If the code ever gets here, something is broken, so we just reset the client's state.
					std::fill(UTIL_RANGE(data), '\0');
					std::fill(UTIL_RANGE(this->data), '\0');
					data.erase();
					this->data.erase();
					this->packet_state = EOClient::ReadLen1;
			}
		}
	}
}